

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmBinUtilsMacOSMachOLinker.cxx
# Opt level: O2

bool __thiscall
cmBinUtilsMacOSMachOLinker::ResolveDependency
          (cmBinUtilsMacOSMachOLinker *this,string *name,string *executablePath,string *loaderPath,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *rpaths,string *path,bool *resolved)

{
  bool bVar1;
  bool bVar2;
  string *psVar3;
  allocator<char> local_61;
  cmBinUtilsMacOSMachOLinker *local_60;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_58;
  string local_50;
  
  *resolved = false;
  local_58 = rpaths;
  bVar1 = cmHasLiteralPrefix<std::__cxx11::string,8ul>(name,(char (*) [8])"@rpath/");
  local_60 = this;
  if (bVar1) {
    ResolveRPathDependency(this,name,executablePath,loaderPath,local_58,path,resolved);
  }
  else {
    psVar3 = name;
    bVar1 = cmHasLiteralPrefix<std::__cxx11::string,14ul>(name,(char (*) [14])"@loader_path/");
    if (bVar1) {
      ResolveLoaderPathDependency
                ((cmBinUtilsMacOSMachOLinker *)psVar3,name,loaderPath,path,resolved);
    }
    else {
      psVar3 = name;
      bVar1 = cmHasLiteralPrefix<std::__cxx11::string,18ul>(name,(char (*) [18])"@executable_path/")
      ;
      if (bVar1) {
        ResolveExecutablePathDependency
                  ((cmBinUtilsMacOSMachOLinker *)psVar3,name,executablePath,path,resolved);
      }
      else {
        *resolved = true;
        std::__cxx11::string::_M_assign((string *)path);
      }
    }
  }
  bVar1 = true;
  if (*resolved == true) {
    bVar2 = cmsys::SystemTools::FileIsFullPath(path);
    if (!bVar2) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_50,"Resolved path is not absolute",&local_61);
      cmBinUtilsLinker::SetError(&local_60->super_cmBinUtilsLinker,&local_50);
      std::__cxx11::string::~string((string *)&local_50);
      bVar1 = false;
    }
  }
  return bVar1;
}

Assistant:

bool cmBinUtilsMacOSMachOLinker::ResolveDependency(
  std::string const& name, std::string const& executablePath,
  std::string const& loaderPath, std::vector<std::string> const& rpaths,
  std::string& path, bool& resolved)
{
  resolved = false;
  if (cmHasLiteralPrefix(name, "@rpath/")) {
    if (!this->ResolveRPathDependency(name, executablePath, loaderPath, rpaths,
                                      path, resolved)) {
      return false;
    }
  } else if (cmHasLiteralPrefix(name, "@loader_path/")) {
    if (!this->ResolveLoaderPathDependency(name, loaderPath, path, resolved)) {
      return false;
    }
  } else if (cmHasLiteralPrefix(name, "@executable_path/")) {
    if (!this->ResolveExecutablePathDependency(name, executablePath, path,
                                               resolved)) {
      return false;
    }
  } else {
    resolved = true;
    path = name;
  }

  if (resolved && !cmSystemTools::FileIsFullPath(path)) {
    this->SetError("Resolved path is not absolute");
    return false;
  }

  return true;
}